

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::WeakFulfiller<kj::HttpClient::WebSocketResponse>::detach
          (WeakFulfiller<kj::HttpClient::WebSocketResponse> *this,
          PromiseFulfiller<kj::HttpClient::WebSocketResponse> *from)

{
  PromiseFulfiller<kj::HttpClient::WebSocketResponse> *from_local;
  WeakFulfiller<kj::HttpClient::WebSocketResponse> *this_local;
  
  if (this->inner == (PromiseFulfiller<kj::HttpClient::WebSocketResponse> *)0x0) {
    if (this != (WeakFulfiller<kj::HttpClient::WebSocketResponse> *)0x0) {
      operator_delete(this,0x18);
    }
  }
  else {
    if (this->inner != from) {
      inlineRequireFailure
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/../kj/async-inl.h"
                 ,0x41e,"inner == &from","",(char *)0x0);
    }
    this->inner = (PromiseFulfiller<kj::HttpClient::WebSocketResponse> *)0x0;
  }
  return;
}

Assistant:

void detach(PromiseFulfiller<T>& from) {
    if (inner == nullptr) {
      // Already disposed.
      delete this;
    } else {
      KJ_IREQUIRE(inner == &from);
      inner = nullptr;
    }
  }